

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.hpp
# Opt level: O1

void __thiscall ColorPrimariesBT2020::ColorPrimariesBT2020(ColorPrimariesBT2020 *this)

{
  long lVar1;
  initializer_list<float> __l;
  initializer_list<float> __l_00;
  allocator_type local_e2;
  allocator_type local_e1;
  vector<float,_std::allocator<float>_> local_e0;
  undefined8 local_c8;
  undefined8 uStack_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  float local_a8;
  undefined8 local_a4;
  undefined8 uStack_9c;
  undefined8 local_94;
  undefined8 uStack_8c;
  float local_84;
  vector<float,_std::allocator<float>_> local_80;
  float local_68 [12];
  float local_38 [10];
  
  local_38[4] = 0.677998;
  local_38[5] = 0.059302;
  local_38[6] = 0.0;
  local_38[7] = 0.028073;
  local_38[0] = 0.636958;
  local_38[1] = 0.144617;
  local_38[2] = 0.168881;
  local_38[3] = 0.2627;
  local_38[8] = 1.060985;
  __l._M_len = 9;
  __l._M_array = local_38;
  std::vector<float,_std::allocator<float>_>::vector(&local_e0,__l,&local_e1);
  lVar1 = 0;
  do {
    *(undefined4 *)((long)&uStack_9c + lVar1) =
         *(undefined4 *)
          ((long)local_e0.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_start + lVar1 + 8);
    *(undefined8 *)((long)&local_a4 + lVar1) =
         *(undefined8 *)
          ((long)local_e0.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_start + lVar1);
    lVar1 = lVar1 + 0xc;
  } while (lVar1 != 0x24);
  local_68[4] = 1.616481;
  local_68[5] = 0.015769;
  local_68[6] = 0.01764;
  local_68[7] = -0.042771;
  local_68[0] = 1.716651;
  local_68[1] = -0.355671;
  local_68[2] = -0.253366;
  local_68[3] = -0.666684;
  local_68[8] = 0.942103;
  __l_00._M_len = 9;
  __l_00._M_array = local_68;
  std::vector<float,_std::allocator<float>_>::vector(&local_80,__l_00,&local_e2);
  lVar1 = 0;
  do {
    *(undefined4 *)((long)&uStack_c0 + lVar1) =
         *(undefined4 *)
          ((long)local_80.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_start + lVar1 + 8);
    *(undefined8 *)((long)&local_c8 + lVar1) =
         *(undefined8 *)
          ((long)local_80.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_start + lVar1);
    lVar1 = lVar1 + 0xc;
  } while (lVar1 != 0x24);
  (this->super_ColorPrimaries).toXYZ.matrix[2][2] = local_84;
  *(undefined8 *)((this->super_ColorPrimaries).toXYZ.matrix[1] + 1) = local_94;
  *(undefined8 *)(this->super_ColorPrimaries).toXYZ.matrix[2] = uStack_8c;
  *(undefined8 *)(this->super_ColorPrimaries).toXYZ.matrix[0] = local_a4;
  *(undefined8 *)((this->super_ColorPrimaries).toXYZ.matrix[0] + 2) = uStack_9c;
  *(undefined8 *)(this->super_ColorPrimaries).fromXYZ.matrix[0] = local_c8;
  *(undefined8 *)((this->super_ColorPrimaries).fromXYZ.matrix[0] + 2) = uStack_c0;
  *(undefined8 *)((this->super_ColorPrimaries).fromXYZ.matrix[1] + 1) = local_b8;
  *(undefined8 *)(this->super_ColorPrimaries).fromXYZ.matrix[2] = uStack_b0;
  (this->super_ColorPrimaries).fromXYZ.matrix[2][2] = local_a8;
  if (local_80.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_80.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_80.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_80.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_e0.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_e0.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_e0.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_e0.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

ColorPrimariesBT2020() : ColorPrimaries(
        ColorPrimaryTransform({
            +0.636958f, +0.144617f, +0.168881f,
            +0.262700f, +0.677998f, +0.059302f,
            +0.000000f, +0.028073f, +1.060985f
        }),
        ColorPrimaryTransform({
            +1.716651f, -0.355671f, -0.253366f,
            -0.666684f, +1.616481f, +0.015769f,
            +0.017640f, -0.042771f, +0.942103f
        })
    ) {}